

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool anon_unknown.dwarf_1d24e4::cmCTestAddSubdirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  bool bVar1;
  const_reference args_00;
  string local_118;
  cmAlphaNum local_f8;
  string local_c8;
  cmAlphaNum local_a8;
  undefined1 local_78 [8];
  string fname;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  this = local_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    cmAlphaNum::cmAlphaNum(&local_a8,&local_c8);
    cmAlphaNum::cmAlphaNum(&local_f8,'/');
    args_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,0);
    cmStrCat<std::__cxx11::string>((string *)local_78,&local_a8,&local_f8,args_00);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string((string *)&local_118,(string *)local_78);
    args_local._7_1_ = ReadSubdirectory(&local_118,local_20);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)local_78);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmCTestAddSubdirectoryCommand(std::vector<std::string> const& args,
                                   cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string fname =
    cmStrCat(cmSystemTools::GetCurrentWorkingDirectory(), '/', args[0]);

  return ReadSubdirectory(std::move(fname), status);
}